

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1438780::Y4mVideoWriteTest_WriteTest_Test::TestBody
          (Y4mVideoWriteTest_WriteTest_Test *this)

{
  uint bit_depth;
  aom_img_fmt_t fmt;
  char *pcVar1;
  ParamType *pPVar2;
  allocator local_41;
  string local_40;
  
  pPVar2 = testing::WithParamInterface<(anonymous_namespace)::Y4mTestParam>::GetParam();
  bit_depth = pPVar2->bit_depth;
  fmt = pPVar2->format;
  pcVar1 = pPVar2->md5raw;
  std::__cxx11::string::string((string *)&local_40,pPVar2->filename,&local_41);
  (*(this->super_Y4mVideoWriteTest).super_Y4mVideoSourceTest.
    super_TestWithParam<(anonymous_namespace)::Y4mTestParam>.super_Test._vptr_Test[6])
            (this,&local_40,10);
  std::__cxx11::string::~string((string *)&local_40);
  Y4mVideoSourceTest::HeaderChecks((Y4mVideoSourceTest *)this,bit_depth,fmt);
  std::__cxx11::string::string((string *)&local_40,pcVar1,&local_41);
  Y4mVideoSourceTest::Md5Check((Y4mVideoSourceTest *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

TEST_P(Y4mVideoWriteTest, WriteTest) {
  const Y4mTestParam t = GetParam();
  Init(t.filename, kFrames);
  HeaderChecks(t.bit_depth, t.format);
  Md5Check(t.md5raw);
}